

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::ContainerEqMatcher<std::array<solitaire::cards::Card,52ul>>::
MatchAndExplain<std::array<solitaire::cards::Card,52ul>>
          (ContainerEqMatcher<std::array<solitaire::cards::Card,52ul>> *this,
          array<solitaire::cards::Card,_52UL> *lhs,MatchResultListener *listener)

{
  Card *rhs;
  ostream *os;
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  lVar5 = 0;
  do {
    bVar1 = solitaire::cards::operator==
                      ((Card *)((long)&lhs->_M_elems[0].value + lVar5),(Card *)(this + lVar5));
    if (!bVar1) break;
    bVar7 = lVar5 != 0x198;
    lVar5 = lVar5 + 8;
  } while (bVar7);
  if ((!bVar1) && (os = listener->stream_, os != (ostream *)0x0)) {
    lVar5 = 0;
    bVar7 = false;
    do {
      rhs = (Card *)((long)&lhs->_M_elems[0].value + lVar5);
      lVar6 = 0;
      do {
        bVar2 = solitaire::cards::operator==((Card *)(this + lVar6),rhs);
        if (bVar2) {
          if (lVar6 != 0x1a0) goto LAB_001adf06;
          break;
        }
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0x1a0);
      if (bVar7) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,"which has these unexpected elements: ",0x25);
        bVar7 = true;
      }
      solitaire::cards::operator<<(os,rhs);
LAB_001adf06:
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x1a0);
    pcVar3 = "which";
    if (bVar7) {
      pcVar3 = ",\nand";
    }
    lVar5 = 0;
    bVar7 = false;
    do {
      lVar6 = 0;
      do {
        bVar2 = solitaire::cards::operator==
                          ((Card *)((long)&lhs->_M_elems[0].value + lVar6),(Card *)(this + lVar5));
        if (bVar2) {
          if (lVar6 != 0x1a0) goto LAB_001adfc4;
          break;
        }
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0x1a0);
      if (bVar7) {
        lVar6 = 2;
        pcVar4 = ", ";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,5);
        lVar6 = 0x27;
        pcVar4 = " doesn\'t have these expected elements: ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,lVar6);
      solitaire::cards::operator<<(os,(Card *)(this + lVar5));
      bVar7 = true;
LAB_001adfc4:
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x1a0);
  }
  return bVar1;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }